

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     BinaryUpdateLoop<duckdb::ArgMinMaxState<duckdb::string_t,duckdb::string_t>,duckdb::string_t,duckdb::string_t,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
               (string_t *adata,AggregateInputData *aggr_input_data,string_t *bdata,
               ArgMinMaxState<duckdb::string_t,_duckdb::string_t> *state,idx_t count,
               SelectionVector *asel,SelectionVector *bsel,ValidityMask *avalidity,
               ValidityMask *bvalidity)

{
  bool bVar1;
  AggregateBinaryInput *pAVar2;
  ArgMinMaxState<duckdb::string_t,_duckdb::string_t> *in_RCX;
  AggregateInputData *in_RSI;
  string_t *in_R8;
  SelectionVector *in_R9;
  idx_t i_1;
  idx_t i;
  AggregateBinaryInput input;
  string_t *local_68;
  string_t *idx;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffffa8;
  
  AggregateBinaryInput::AggregateBinaryInput
            ((AggregateBinaryInput *)&stack0xffffffffffffffa8,in_RSI,(ValidityMask *)input.input,
             input.left_mask);
  bVar1 = ArgMinMaxBase<duckdb::GreaterThan,_true>::IgnoreNull();
  if ((!bVar1) ||
     ((bVar1 = TemplatedValidityMask<unsigned_long>::AllValid
                         ((TemplatedValidityMask<unsigned_long> *)input.input), bVar1 &&
      (bVar1 = TemplatedValidityMask<unsigned_long>::AllValid
                         (&(input.left_mask)->super_TemplatedValidityMask<unsigned_long>), bVar1))))
  {
    for (local_68 = (string_t *)0x0; local_68 < in_R8;
        local_68 = (string_t *)((long)&local_68->value + 1)) {
      SelectionVector::get_index(in_R9,(idx_t)local_68);
      pAVar2 = (AggregateBinaryInput *)
               SelectionVector::get_index((SelectionVector *)i,(idx_t)local_68);
      ArgMinMaxBase<duckdb::GreaterThan,true>::
      Operation<duckdb::string_t,duckdb::string_t,duckdb::ArgMinMaxState<duckdb::string_t,duckdb::string_t>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
                (in_RCX,in_R8,(string_t *)in_R9,pAVar2);
    }
  }
  else {
    for (idx = (string_t *)0x0; idx < in_R8; idx = (string_t *)((long)&idx->value + 1)) {
      SelectionVector::get_index(in_R9,(idx_t)idx);
      pAVar2 = (AggregateBinaryInput *)SelectionVector::get_index((SelectionVector *)i,(idx_t)idx);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid(in_stack_ffffffffffffffa8,(idx_t)idx)
      ;
      if ((bVar1) &&
         (bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                            (in_stack_ffffffffffffffa8,(idx_t)idx), bVar1)) {
        ArgMinMaxBase<duckdb::GreaterThan,true>::
        Operation<duckdb::string_t,duckdb::string_t,duckdb::ArgMinMaxState<duckdb::string_t,duckdb::string_t>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
                  (in_RCX,in_R8,(string_t *)in_R9,pAVar2);
      }
    }
  }
  return;
}

Assistant:

static inline void BinaryUpdateLoop(const A_TYPE *__restrict adata, AggregateInputData &aggr_input_data,
	                                    const B_TYPE *__restrict bdata, STATE_TYPE *__restrict state, idx_t count,
	                                    const SelectionVector &asel, const SelectionVector &bsel,
	                                    ValidityMask &avalidity, ValidityMask &bvalidity) {
		AggregateBinaryInput input(aggr_input_data, avalidity, bvalidity);
		if (OP::IgnoreNull() && (!avalidity.AllValid() || !bvalidity.AllValid())) {
			// potential NULL values and NULL values are ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				if (avalidity.RowIsValid(input.lidx) && bvalidity.RowIsValid(input.ridx)) {
					OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*state, adata[input.lidx], bdata[input.ridx],
					                                                       input);
				}
			}
		} else {
			// quick path: no NULL values or NULL values are not ignored
			for (idx_t i = 0; i < count; i++) {
				input.lidx = asel.get_index(i);
				input.ridx = bsel.get_index(i);
				OP::template Operation<A_TYPE, B_TYPE, STATE_TYPE, OP>(*state, adata[input.lidx], bdata[input.ridx],
				                                                       input);
			}
		}
	}